

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O3

void __thiscall
Variable_variableInterfaceDontDowngradeFromPublicAndPrivate_Test::TestBody
          (Variable_variableInterfaceDontDowngradeFromPublicAndPrivate_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  char cVar3;
  char *pcVar4;
  AssertionResult gtest_ar_;
  VariablePtr v2;
  VariablePtr v1;
  VariablePtr v3;
  ComponentPtr c2;
  ComponentPtr c1;
  ComponentPtr c3;
  ModelPtr model;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  long *local_a0;
  internal local_98 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  AssertHelper local_88 [8];
  string *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  string *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  psVar2 = local_20;
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"model","");
  libcellml::NamedEntity::setName(psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  psVar2 = local_40;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"c1","");
  libcellml::NamedEntity::setName(psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  psVar2 = local_50;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"c2","");
  libcellml::NamedEntity::setName(psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  psVar2 = local_30;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"c3","");
  libcellml::NamedEntity::setName(psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_20);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_40);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_50);
  libcellml::Variable::create();
  psVar2 = local_70;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"v1","");
  libcellml::NamedEntity::setName(psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  psVar2 = local_70;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"dimensionless","");
  libcellml::Variable::setUnits(psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"public_and_private","");
  libcellml::Variable::setInterfaceType(local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  libcellml::Variable::create();
  psVar2 = local_80;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"v2","");
  libcellml::NamedEntity::setName(psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"dimensionless","");
  libcellml::Variable::setUnits(local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  libcellml::Variable::create();
  psVar2 = local_60;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"v3","");
  libcellml::NamedEntity::setName(psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"dimensionless","");
  libcellml::Variable::setUnits(local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  libcellml::Component::addVariable((shared_ptr *)local_40);
  libcellml::Component::addVariable((shared_ptr *)local_50);
  libcellml::Component::addVariable((shared_ptr *)local_30);
  libcellml::Variable::addEquivalence((shared_ptr *)&local_70,(shared_ptr *)&local_80);
  libcellml::Variable::addEquivalence((shared_ptr *)&local_80,(shared_ptr *)&local_60);
  local_98[0] = (internal)libcellml::Model::fixVariableInterfaces();
  local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_c0,(char *)local_98,"model->fixVariableInterfaces()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x6f5,local_c0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (local_a0 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_a0 != (long *)0x0)) {
        (**(code **)(*local_a0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Variable::interfaceType_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[19],std::__cxx11::string>
            (local_98,"\"public_and_private\"","v1->interfaceType()",
             (char (*) [19])"public_and_private",&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x6f7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_c0._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Variable::interfaceType_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[19],std::__cxx11::string>
            (local_98,"\"public_and_private\"","v2->interfaceType()",
             (char (*) [19])"public_and_private",&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x6f8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_c0._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Variable::interfaceType_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            (local_98,"\"public\"","v3->interfaceType()",(char (*) [7])"public",&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x6f9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_c0._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Variable, variableInterfaceDontDowngradeFromPublicAndPrivate)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::ComponentPtr c3 = libcellml::Component::create();

    model->setName("model");
    c1->setName("c1");
    c2->setName("c2");
    c3->setName("c3");

    model->addComponent(c1);
    c1->addComponent(c2);
    c2->addComponent(c3);

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    v1->setName("v1");
    v1->setUnits("dimensionless");
    v1->setInterfaceType("public_and_private");

    libcellml::VariablePtr v2 = libcellml::Variable::create();
    v2->setName("v2");
    v2->setUnits("dimensionless");

    libcellml::VariablePtr v3 = libcellml::Variable::create();
    v3->setName("v3");
    v3->setUnits("dimensionless");

    c1->addVariable(v1);
    c2->addVariable(v2);
    c3->addVariable(v3);

    libcellml::Variable::addEquivalence(v1, v2);
    libcellml::Variable::addEquivalence(v2, v3);

    EXPECT_TRUE(model->fixVariableInterfaces());

    EXPECT_EQ("public_and_private", v1->interfaceType());
    EXPECT_EQ("public_and_private", v2->interfaceType());
    EXPECT_EQ("public", v3->interfaceType());
}